

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_value_tmp_tests.hpp
# Opt level: O0

TestSuite *
iutest::tr1::
ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,_iutest::detail::VariadicTypeList<iutest::TemplateValue<10L>,_iutest::TemplateValue<0L>_>_>
::
EachTest<iutest::detail::VariadicTypeList<iutest::TemplateValue<10L>,_iutest::TemplateValue<0L>_>,_void>
::AddTestSuite(char *testsuite,size_t index,char *file,int line)

{
  UnitTest *this;
  char *__s;
  TypeId id;
  SetUpTearDownTestSuiteFuncType setup;
  SetUpTearDownTestSuiteFuncType teardown;
  TestSuite *pTVar1;
  undefined4 in_register_0000000c;
  size_t index_00;
  allocator<char> local_69;
  string local_68;
  string local_48;
  int local_24;
  char *pcStack_20;
  int line_local;
  char *file_local;
  size_t index_local;
  char *testsuite_local;
  
  index_00 = CONCAT44(in_register_0000000c,line);
  local_24 = line;
  pcStack_20 = file;
  file_local = (char *)index;
  index_local = (size_t)testsuite;
  this = UnitTest::instance();
  ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
  ::MakeTestSuiteName_abi_cxx11_
            (&local_68,
             (ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
              *)index_local,file_local,index_00);
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_69);
  id = internal::GetTypeId<iutest::detail::None>();
  setup = legacy::SuiteApiResolver<iu_TestValueType_x_iutest_x_Equal_Test<10L>_>::
          GetSetUpCaseOrSuite(pcStack_20,local_24);
  teardown = legacy::SuiteApiResolver<iu_TestValueType_x_iutest_x_Equal_Test<10L>_>::
             GetTearDownCaseOrSuite(pcStack_20,local_24);
  pTVar1 = UnitTestImpl::AddTestSuite<iutest::TypedTestSuite<iutest::TemplateValue<10l>>>
                     (&this->super_UnitTestImpl,&local_48,id,setup,teardown);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_68);
  return pTVar1;
}

Assistant:

static TestSuite* AddTestSuite(const char* testsuite, size_t index, const char* file, int line)
        {
#if !defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
            return UnitTest::instance().AddTestSuite<_MyTestSuite>(
#else
            return UnitTest::instance().AddTestSuite(
#endif
                MakeTestSuiteName(testsuite, index).c_str()
                , internal::GetTypeId<detail::None>()   // TypeId を統一するためダミー引数を渡す
                , IUTEST_GET_SETUP_TESTSUITE(TestBody, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(TestBody, file, line)
#if defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
                , detail::explicit_type<_MyTestSuite>()
#endif
                );
        }